

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void Interrupt(NodeContext *node)

{
  CConnman *this;
  pointer ppBVar1;
  pointer ptVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cmd;
  pointer __args_1;
  pointer ptVar3;
  pointer ppBVar4;
  long in_FS_OFFSET;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::thread,_std::allocator<std::thread>_> local_68;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.field_2._M_allocated_capacity._0_7_ = 0x6f64747568732d;
  local_50.field_2._M_local_buf[7] = 'w';
  local_50.field_2._8_7_ = 0x796669746f6e6e;
  local_50._M_string_length = 0xf;
  local_50.field_2._M_local_buf[0xf] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ArgsManager::GetArgs(&local_80,node->args,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT17(local_50.field_2._M_local_buf[7],
                             local_50.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args_1 = local_80.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(&)(std::__cxx11::string_const&),std::__cxx11::string_const&>
                ((vector<std::thread,std::allocator<std::thread>> *)&local_68,runCommand,__args_1);
      __args_1 = __args_1 + 1;
    } while (__args_1 !=
             local_80.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  ptVar2 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar3 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar3 != ptVar2; ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_68);
  InterruptHTTPServer();
  InterruptHTTPRPC();
  InterruptRPC();
  InterruptREST();
  InterruptTorControl();
  InterruptMapPort();
  this = (node->connman)._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
         super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
         super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
  if (this != (CConnman *)0x0) {
    CConnman::Interrupt(this);
  }
  ppBVar1 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar4 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1; ppBVar4 = ppBVar4 + 1
      ) {
    BaseIndex::Interrupt(*ppBVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Interrupt(NodeContext& node)
{
#if HAVE_SYSTEM
    ShutdownNotify(*node.args);
#endif
    InterruptHTTPServer();
    InterruptHTTPRPC();
    InterruptRPC();
    InterruptREST();
    InterruptTorControl();
    InterruptMapPort();
    if (node.connman)
        node.connman->Interrupt();
    for (auto* index : node.indexes) {
        index->Interrupt();
    }
}